

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O2

int arrow_array_stream_wrapper::anon_unknown_0::GetSchema(ArrowArrayStream *stream,ArrowSchema *out)

{
  long lVar1;
  undefined8 *puVar2;
  ArrowSchema *pAVar3;
  
  if (*stream->private_data != (undefined8 *)0x0) {
    puVar2 = *stream->private_data;
    pAVar3 = out;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      pAVar3->format = (char *)*puVar2;
      puVar2 = puVar2 + 1;
      pAVar3 = (ArrowSchema *)&pAVar3->name;
    }
    out->release = EmptySchemaRelease;
    return 0;
  }
  return 1;
}

Assistant:

int GetSchema(struct ArrowArrayStream *stream, struct ArrowSchema *out) {
	auto private_data = static_cast<arrow_array_stream_wrapper::PrivateData *>((stream->private_data));
	if (private_data->schema == nullptr) {
		return DuckDBError;
	}

	*out = *private_data->schema;
	out->release = EmptySchemaRelease;
	return DuckDBSuccess;
}